

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

bool __thiscall
QListSpecialMethodsBase<QUrl>::contains<QUrl>(QListSpecialMethodsBase<QUrl> *this,QUrl *t)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  bool bVar5;
  
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 == 0) {
LAB_004f7e7f:
    bVar5 = false;
  }
  else {
    lVar2 = *(long *)(this + 8);
    lVar4 = 0;
    do {
      if (lVar1 << 3 == lVar4) goto LAB_004f7e7f;
      cVar3 = comparesEqual((QUrl *)(lVar2 + lVar4),t);
      lVar4 = lVar4 + 8;
    } while (cVar3 == '\0');
    bVar5 = *(long *)(this + 8) - lVar2 != lVar4;
  }
  return bVar5;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }